

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Object3D.cpp
# Opt level: O3

Ray * __thiscall Area::sample(Ray *__return_storage_ptr__,Area *this)

{
  int iVar1;
  Ray *ray;
  Area *pAVar2;
  float extraout_XMM0_Da;
  float extraout_XMM0_Da_00;
  float fVar3;
  float fVar4;
  default_random_engine generator;
  Hit cosineWeightedHit;
  Vector3f source;
  Vector3f local_a0;
  Vector3f local_94;
  linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> local_88;
  undefined1 local_80 [24];
  undefined1 local_68 [8];
  undefined8 local_60;
  Vector3f local_58 [2];
  Vector3f local_3c;
  
  pAVar2 = this;
  iVar1 = rand();
  local_88._M_x = (ulong)(long)iVar1 % 0x7fffffff + (ulong)((ulong)(long)iVar1 % 0x7fffffff == 0);
  iVar1 = (int)pAVar2;
  Vector3f::abs(&this->_sideOne,iVar1);
  Vector3f::abs(&this->_sideTwo,iVar1);
  fVar3 = std::
          generate_canonical<float,24ul,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>>
                    (&local_88);
  fVar4 = std::
          generate_canonical<float,24ul,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>>
                    (&local_88);
  Vector3f::normalized(&this->_sideOne);
  ::operator*(fVar3 * extraout_XMM0_Da + 0.0,(Vector3f *)local_80);
  operator+(&this->_corner,(Vector3f *)local_80);
  Vector3f::normalized(&this->_sideTwo);
  ::operator*(fVar4 * extraout_XMM0_Da_00 + 0.0,&local_a0);
  operator+((Vector3f *)local_68,&local_a0);
  local_68._0_4_ = 3.4028235e+38;
  local_60 = (Material *)0x0;
  Vector3f::Vector3f(local_58,0.0);
  local_60 = (this->super_Object3D).material;
  local_68._0_4_ = 0.0;
  Vector3f::operator=(local_58,&this->_normal);
  ray = (Ray *)operator_new(8);
  *(undefined ***)(ray->_origin).m_elements = &PTR__Sampler_0013fbe8;
  Vector3f::Vector3f((Vector3f *)local_80,&local_3c);
  Vector3f::Vector3f((Vector3f *)(local_80 + 0xc),&this->_normal);
  cosineWeightedHemisphere::sample((cosineWeightedHemisphere *)&local_a0,ray,(Hit *)local_80);
  Vector3f::normalized(&local_a0);
  Vector3f::Vector3f(&__return_storage_ptr__->_origin,&local_3c);
  Vector3f::Vector3f(&__return_storage_ptr__->_direction,&local_94);
  return __return_storage_ptr__;
}

Assistant:

const Ray Area::sample() {
    // First, select a random point on the area.
    // Create generators for the sampling and get random lengths.
    std::default_random_engine generator(rand());
    std::uniform_real_distribution<float> sideOneDist(0., _sideOne.abs());
    std::uniform_real_distribution<float> sideTwoDist(0., _sideTwo.abs());
    float sideOneScale = sideOneDist(generator);
    float sideTwoScale = sideTwoDist(generator);

    // Fetch the random point and use a cosine weighted sampler (first two args don't matter).
    Vector3f source = _corner + sideOneScale * _sideOne.normalized() + sideTwoScale * _sideTwo.normalized();
    Hit cosineWeightedHit;
    cosineWeightedHit.set(0, this->material, _normal);
    Sampler *sampler = new cosineWeightedHemisphere;
    return Ray(source, sampler->sample(Ray(source, _normal), cosineWeightedHit).normalized());
}